

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Pipeline::Pipeline(Pipeline *this,Pipeline *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Pipeline_004865c0;
  (this->models_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->models_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->models_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
            (&(this->models_).super_RepeatedPtrFieldBase,&(from->models_).super_RepeatedPtrFieldBase
            );
  (this->names_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->names_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->names_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->names_).super_RepeatedPtrFieldBase,&(from->names_).super_RepeatedPtrFieldBase);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

Pipeline::Pipeline(const Pipeline& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      models_(from.models_),
      names_(from.names_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Pipeline)
}